

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_write.cpp
# Opt level: O1

void __thiscall
ritobin::io::impl_binary_write::BinaryWriter::write<float,4ul>
          (BinaryWriter *this,array<float,_4UL> *value)

{
  char buffer [16];
  float local_18;
  float fStack_14;
  float fStack_10;
  float fStack_c;
  
  local_18 = value->_M_elems[0];
  fStack_14 = value->_M_elems[1];
  fStack_10 = value->_M_elems[2];
  fStack_c = value->_M_elems[3];
  std::vector<char,std::allocator<char>>::_M_range_insert<char*>
            ((vector<char,std::allocator<char>> *)this->buffer_,
             *(undefined8 *)((vector<char,std::allocator<char>> *)this->buffer_ + 8),&local_18);
  return;
}

Assistant:

void write(std::array<T, S> const& value) noexcept {
            static_assert(std::is_arithmetic_v<T>);
            char buffer[sizeof(T) * S];
            memcpy(buffer, value.data(), sizeof(T) * S);
            buffer_.insert(buffer_.end(), buffer, buffer + sizeof(T) * S);
        }